

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestCompressionNoBias8(void)

{
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  
  bVar10 = false;
  uVar7 = 0;
  do {
    uVar2 = uVar7 & 0xff;
    lVar8 = -0x101;
    lVar3 = -0x100000000000000;
    do {
      if (-1 < (long)(uVar7 + lVar8)) {
        uVar6 = uVar7 + lVar8 & 0xff;
        uVar4 = uVar6 | (uint)uVar7 & 0x300;
        if ((uint)uVar2 < (uint)uVar6) {
          uVar5 = uVar4 - 0x100;
          bVar9 = uVar6 - uVar2 < 0x80;
        }
        else {
          uVar5 = uVar4 + 0x100;
          bVar9 = uVar2 - uVar6 < 0x81;
        }
        if (bVar9) {
          uVar5 = uVar4;
        }
        if ((lVar3 >> 0x38) + uVar7 != uVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "!! TestCompressionNoBias8 failed: New algorithm does not match reference version for base = "
                     ,0x5c);
          poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,", offset = ",0xb);
          poVar1 = std::ostream::_M_insert<long>((long)poVar1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          return bVar10;
        }
      }
      lVar8 = lVar8 + 1;
      lVar3 = lVar3 + 0x100000000000000;
    } while (lVar8 != 0x101);
    bVar10 = 0x1ff < uVar7;
    uVar7 = uVar7 + 1;
    if (uVar7 == 0x201) {
      return true;
    }
  } while( true );
}

Assistant:

bool TestCompressionNoBias8()
{
    for (int64_t base = 0; base < 256 * 2 + 1; ++base)
    {
        for (int64_t offset = -256 - 1; offset < 256 + 1; ++offset)
        {
            const int64_t neighbor = base + offset;
            if (neighbor < 0) {
                continue;
            }

            Counter64 recent = base;
            Counter8 smaller = (uint8_t)neighbor;
            Counter64 reconstructed = Counter64::ExpandFromTruncated(recent, smaller);

            // Compare with reference version
            Counter64 ref_reconstructed = Counter64::ExpandFromTruncatedWithBias(recent, smaller, 0);

            if (reconstructed.ToUnsigned() != ref_reconstructed.ToUnsigned())
            {
                std::cout << "!! TestCompressionNoBias8 failed: New algorithm does not match reference version for base = " << base << ", offset = " << offset << std::endl;

                COUNTER_DEBUG_BREAK();
                return false;
            }
        }
    }

    return true;
}